

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlXPathParserContextPtrWrap(xmlXPathParserContextPtr ctxt)

{
  PyObject *ret;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    ctxt_local = (xmlXPathParserContextPtr)&_Py_NoneStruct;
  }
  else {
    ctxt_local = (xmlXPathParserContextPtr)PyCapsule_New(ctxt,"xmlXPathParserContextPtr",0);
  }
  return (PyObject *)ctxt_local;
}

Assistant:

PyObject *
libxml_xmlXPathParserContextPtrWrap(xmlXPathParserContextPtr ctxt)
{
    PyObject *ret;

    if (ctxt == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret = PyCapsule_New((void *)ctxt, (char *)"xmlXPathParserContextPtr", NULL);
    return (ret);
}